

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  TestResult *this;
  ostream *poVar5;
  char *pcVar6;
  internal *piVar7;
  TestPartResult *this_00;
  int width;
  int width_00;
  int width_01;
  int width_02;
  TimeInMillis ms;
  long in_FS_OFFSET;
  TestPartResult *part;
  int i;
  int failures;
  TestResult *result;
  TestInfo *test_info_local;
  char *test_case_name_local;
  ostream *stream_local;
  allocator<char> local_338;
  allocator<char> local_337;
  allocator<char> local_336;
  allocator<char> local_335;
  allocator<char> local_334;
  allocator<char> local_333;
  allocator<char> local_332;
  allocator<char> local_331;
  string local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  undefined1 local_2d0 [8];
  string message;
  string location;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  undefined1 local_50 [8];
  string kIndent;
  string kTestcase;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = TestInfo::result(test_info);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(kIndent.field_2._M_local_buf + 8),"testcase",&local_331);
  std::allocator<char>::~allocator(&local_331);
  Indent_abi_cxx11_((string *)local_50,(internal *)0xa,width);
  Indent_abi_cxx11_(&local_70,(internal *)0x8,width_00);
  poVar5 = std::operator<<(stream,(string *)&local_70);
  std::operator<<(poVar5,"{\n");
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"name",&local_332);
  pcVar6 = TestInfo::name(test_info);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pcVar6,&local_333);
  OutputJsonKey(stream,(string *)((long)&kIndent.field_2 + 8),&local_90,&local_b0,(string *)local_50
                ,true);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_333);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_332);
  pcVar6 = TestInfo::value_param(test_info);
  if (pcVar6 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"value_param",&local_334)
    ;
    pcVar6 = TestInfo::value_param(test_info);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,pcVar6,&local_335);
    OutputJsonKey(stream,(string *)((long)&kIndent.field_2 + 8),&local_d0,&local_f0,
                  (string *)local_50,true);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_335);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_334);
  }
  pcVar6 = TestInfo::type_param(test_info);
  if (pcVar6 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"type_param",&local_336)
    ;
    pcVar6 = TestInfo::type_param(test_info);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,pcVar6,&local_337);
    OutputJsonKey(stream,(string *)((long)&kIndent.field_2 + 8),&local_110,&local_130,
                  (string *)local_50,true);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_337);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_336);
  }
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"status",(allocator<char> *)((long)&stream_local + 5));
    bVar2 = TestInfo::should_run(test_info);
    pcVar6 = "NOTRUN";
    if (bVar2) {
      pcVar6 = "RUN";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,pcVar6,(allocator<char> *)((long)&stream_local + 4));
    OutputJsonKey(stream,(string *)((long)&kIndent.field_2 + 8),&local_1d0,&local_1f0,
                  (string *)local_50,true);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&stream_local + 4));
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&stream_local + 5));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"time",(allocator<char> *)((long)&stream_local + 3));
    piVar7 = (internal *)TestResult::elapsed_time(this);
    FormatTimeInMillisAsDuration_abi_cxx11_(&local_230,piVar7,ms);
    OutputJsonKey(stream,(string *)((long)&kIndent.field_2 + 8),&local_210,&local_230,
                  (string *)local_50,true);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator((allocator<char> *)((long)&stream_local + 3));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"classname",(allocator<char> *)((long)&stream_local + 2));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,test_case_name,(allocator<char> *)((long)&stream_local + 1));
    OutputJsonKey(stream,(string *)((long)&kIndent.field_2 + 8),&local_250,&local_270,
                  (string *)local_50,false);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)((long)&stream_local + 1));
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator((allocator<char> *)((long)&stream_local + 2));
    TestPropertiesAsJson((string *)((long)&location.field_2 + 8),this,(string *)local_50);
    std::operator<<(stream,(string *)(location.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(location.field_2._M_local_buf + 8));
    part._4_4_ = 0;
    for (part._0_4_ = 0; iVar3 = TestResult::total_part_count(this), (int)part < iVar3;
        part._0_4_ = (int)part + 1) {
      this_00 = TestResult::GetTestPartResult(this,(int)part);
      bVar2 = TestPartResult::failed(this_00);
      if (bVar2) {
        std::operator<<(stream,",\n");
        part._4_4_ = part._4_4_ + 1;
        if (part._4_4_ == 1) {
          poVar5 = std::operator<<(stream,(string *)local_50);
          poVar5 = std::operator<<(poVar5,"\"");
          poVar5 = std::operator<<(poVar5,"failures");
          std::operator<<(poVar5,"\": [\n");
        }
        piVar7 = (internal *)TestPartResult::file_name(this_00);
        uVar4 = TestPartResult::line_number(this_00);
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  ((string *)((long)&message.field_2 + 8),piVar7,(char *)(ulong)uVar4,iVar3);
        std::operator+(&local_310,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&message.field_2 + 8),"\n");
        pcVar6 = TestPartResult::message(this_00);
        std::operator+(&local_2f0,&local_310,pcVar6);
        EscapeJson((string *)local_2d0,&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_310);
        poVar5 = std::operator<<(stream,(string *)local_50);
        poVar5 = std::operator<<(poVar5,"  {\n");
        poVar5 = std::operator<<(poVar5,(string *)local_50);
        poVar5 = std::operator<<(poVar5,"    \"failure\": \"");
        poVar5 = std::operator<<(poVar5,(string *)local_2d0);
        poVar5 = std::operator<<(poVar5,"\",\n");
        poVar5 = std::operator<<(poVar5,(string *)local_50);
        poVar5 = std::operator<<(poVar5,"    \"type\": \"\"\n");
        poVar5 = std::operator<<(poVar5,(string *)local_50);
        std::operator<<(poVar5,"  }");
        std::__cxx11::string::~string((string *)local_2d0);
        std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
      }
    }
    if (0 < part._4_4_) {
      poVar5 = std::operator<<(stream,"\n");
      poVar5 = std::operator<<(poVar5,(string *)local_50);
      std::operator<<(poVar5,"]");
    }
    poVar5 = std::operator<<(stream,"\n");
    Indent_abi_cxx11_(&local_330,(internal *)0x8,width_02);
    poVar5 = std::operator<<(poVar5,(string *)&local_330);
    std::operator<<(poVar5,"}");
    std::__cxx11::string::~string((string *)&local_330);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"file",&local_338);
    pcVar6 = TestInfo::file(test_info);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,pcVar6,(allocator<char> *)((long)&stream_local + 7));
    OutputJsonKey(stream,(string *)((long)&kIndent.field_2 + 8),&local_150,&local_170,
                  (string *)local_50,true);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)((long)&stream_local + 7));
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_338);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"line",(allocator<char> *)((long)&stream_local + 6));
    iVar3 = TestInfo::line(test_info);
    OutputJsonKey(stream,(string *)((long)&kIndent.field_2 + 8),&local_190,iVar3,(string *)local_50,
                  false);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)((long)&stream_local + 6));
    poVar5 = std::operator<<(stream,"\n");
    Indent_abi_cxx11_(&local_1b0,(internal *)0x8,width_01);
    poVar5 = std::operator<<(poVar5,(string *)&local_1b0);
    std::operator<<(poVar5,"}");
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(kIndent.field_2._M_local_buf + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestInfo(::std::ostream* stream,
                                                   const char* test_case_name,
                                                   const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestcase = "testcase";
  const std::string kIndent = Indent(10);

  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, kTestcase, "name", test_info.name(), kIndent);

  if (test_info.value_param() != NULL) {
    OutputJsonKey(stream, kTestcase, "value_param",
                  test_info.value_param(), kIndent);
  }
  if (test_info.type_param() != NULL) {
    OutputJsonKey(stream, kTestcase, "type_param", test_info.type_param(),
                  kIndent);
  }
  if (GTEST_FLAG(list_tests)) {
    OutputJsonKey(stream, kTestcase, "file", test_info.file(), kIndent);
    OutputJsonKey(stream, kTestcase, "line", test_info.line(), kIndent, false);
    *stream << "\n" << Indent(8) << "}";
    return;
  }

  OutputJsonKey(stream, kTestcase, "status",
                test_info.should_run() ? "RUN" : "NOTRUN", kIndent);
  OutputJsonKey(stream, kTestcase, "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()), kIndent);
  OutputJsonKey(stream, kTestcase, "classname", test_case_name, kIndent, false);
  *stream << TestPropertiesAsJson(result, kIndent);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      *stream << ",\n";
      if (++failures == 1) {
        *stream << kIndent << "\"" << "failures" << "\": [\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string message = EscapeJson(location + "\n" + part.message());
      *stream << kIndent << "  {\n"
              << kIndent << "    \"failure\": \"" << message << "\",\n"
              << kIndent << "    \"type\": \"\"\n"
              << kIndent << "  }";
    }
  }

  if (failures > 0)
    *stream << "\n" << kIndent << "]";
  *stream << "\n" << Indent(8) << "}";
}